

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCAnalyzer.cpp
# Opt level: O1

void __thiscall
SDMMCAnalyzer::ReadCommandBit
          (SDMMCAnalyzer *this,CommandReadState *state,DataReadState *dataState,Frame *frame)

{
  SDMMCAnalyzerResults *pSVar1;
  long lVar2;
  MarkerType MVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  ulong uVar7;
  MMCResponse MVar8;
  
  switch(state->phase) {
  case CMD_INIT:
    iVar4 = AnalyzerChannelData::GetBitState();
    if (iVar4 == 0) {
      pSVar1 = (this->mResults)._M_ptr;
      MVar3 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddMarker((ulonglong)pSVar1,MVar3,(Channel *)0x8);
      state->phase = CMD_DIR;
    }
    break;
  case CMD_DIR:
    iVar4 = AnalyzerChannelData::GetBitState();
    if (iVar4 == 1) {
      state->phase = CMD_IDX;
      return;
    }
    goto LAB_001061aa;
  case CMD_IDX:
    if (state->cmd_idx_cnt == '\0') {
      uVar6 = AnalyzerChannelData::GetSampleNumber();
      *(undefined8 *)frame = uVar6;
      *(undefined8 *)(frame + 0x10) = 0;
      *(undefined8 *)(frame + 0x18) = 0;
      *(undefined2 *)(frame + 0x20) = 1;
    }
    lVar2 = *(long *)(frame + 0x10);
    uVar5 = AnalyzerChannelData::GetBitState();
    *(ulong *)(frame + 0x10) = (ulong)uVar5 | lVar2 * 2;
    if (state->cmd_idx_cnt == '\x05') {
      state->phase = CMD_ARG;
    }
    state->cmd_idx_cnt = state->cmd_idx_cnt + '\x01';
    break;
  case CMD_ARG:
    lVar2 = *(long *)(frame + 0x18);
    uVar5 = AnalyzerChannelData::GetBitState();
    *(ulong *)(frame + 0x18) = (ulong)uVar5 | lVar2 * 2;
    if (state->cmd_arg_cnt == '\x1f') {
      state->phase = CMD_CRC;
      uVar6 = AnalyzerChannelData::GetSampleNumber();
      *(undefined8 *)(frame + 8) = uVar6;
      AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
      AnalyzerResults::CommitResults();
      iVar4 = *(int *)(frame + 0x10);
      state->cmdindex = iVar4;
      dataState->cmdindex = iVar4;
    }
    state->cmd_arg_cnt = state->cmd_arg_cnt + '\x01';
    break;
  case CMD_CRC:
    if (state->cmd_crc_cnt == '\0') {
      uVar6 = AnalyzerChannelData::GetSampleNumber();
      *(undefined8 *)frame = uVar6;
      *(undefined8 *)(frame + 0x10) = 0;
      *(undefined8 *)(frame + 0x18) = 0;
      *(undefined2 *)(frame + 0x20) = 3;
    }
    lVar2 = *(long *)(frame + 0x10);
    uVar5 = AnalyzerChannelData::GetBitState();
    *(ulong *)(frame + 0x10) = (ulong)uVar5 | lVar2 * 2;
    if (state->cmd_crc_cnt == '\x06') {
      state->phase = CMD_STOP;
      uVar6 = AnalyzerChannelData::GetSampleNumber();
      *(undefined8 *)(frame + 8) = uVar6;
      AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
      AnalyzerResults::CommitResults();
    }
    state->cmd_crc_cnt = state->cmd_crc_cnt + '\x01';
    break;
  case CMD_STOP:
    pSVar1 = (this->mResults)._M_ptr;
    MVar3 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddMarker((ulonglong)pSVar1,MVar3,(Channel *)0x9);
    if ((this->mSettings).mProtocol == PROTOCOL_MMC) {
      MVar8 = SDMMCHelpers::MMCCommandResponse(state->cmdindex);
      if (MVar8.mType != MMC_RSP_NONE) {
        state->phase = RESP_INIT;
        state->timeout = MVar8.mTimeout + 3;
        state->resp_data_bits = (U8)MVar8.mBits;
        state->responseType = MVar8.mType;
        if ((MVar8._8_8_ >> 0x28 & 1) == 0) {
          return;
        }
        if ((this->mSettings).mBusWidth == BUS_WIDTH_0) {
          return;
        }
        dataState->phase = DATA_INIT;
        dataState->hasSeveralDataBlocks = (bool)(MVar8.hasSeveralDataBlocks & 1);
        return;
      }
    }
    goto LAB_00106377;
  case RESP_INIT:
    iVar4 = AnalyzerChannelData::GetBitState();
    if (iVar4 == 0) {
      pSVar1 = (this->mResults)._M_ptr;
      MVar3 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddMarker((ulonglong)pSVar1,MVar3,(Channel *)0x8);
      state->phase = RESP_DIR;
    }
    else {
      if (state->timeout == 0) {
        state->phase = CMD_ERROR;
        pSVar1 = (this->mResults)._M_ptr;
        MVar3 = AnalyzerChannelData::GetSampleNumber();
        AnalyzerResults::AddMarker((ulonglong)pSVar1,MVar3,(Channel *)0x6);
        return;
      }
      state->timeout = state->timeout + -1;
    }
    break;
  case RESP_DIR:
    iVar4 = AnalyzerChannelData::GetBitState();
    if (iVar4 == 0) {
      state->phase = RESP_IGNORED;
      return;
    }
LAB_001061aa:
    pSVar1 = (this->mResults)._M_ptr;
    MVar3 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddMarker((ulonglong)pSVar1,MVar3,(Channel *)0x6);
    state->phase = CMD_ERROR;
    break;
  case RESP_IGNORED:
    if (state->resp_ignore_cnt == '\0') {
      uVar6 = AnalyzerChannelData::GetSampleNumber();
      *(undefined8 *)frame = uVar6;
      *(undefined8 *)(frame + 0x10) = 0;
      *(undefined8 *)(frame + 0x18) = 0;
      frame[0x20] = (Frame)0x2;
      frame[0x21] = *(Frame *)&state->responseType;
    }
    if (state->resp_ignore_cnt == '\x05') {
      state->phase = RESP_DATA;
    }
    state->resp_ignore_cnt = state->resp_ignore_cnt + '\x01';
    break;
  case RESP_DATA:
    uVar7 = (ulong)(0x3f < state->resp_data_cnt);
    lVar2 = *(long *)(frame + uVar7 * 8 + 0x10);
    uVar5 = AnalyzerChannelData::GetBitState();
    *(ulong *)(frame + uVar7 * 8 + 0x10) = (ulong)uVar5 | lVar2 * 2;
    if (state->resp_data_cnt == state->resp_data_bits) {
      if ((state->responseType == MMC_RSP_R1) && (((byte)frame[0x10] & 0x40) != 0)) {
        dataState->phase = DATA_NOTSTARTED;
      }
      uVar6 = AnalyzerChannelData::GetSampleNumber();
      *(undefined8 *)(frame + 8) = uVar6;
      AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
      AnalyzerResults::CommitResults();
      if ((state->responseType & ~MMC_RSP_R1) == MMC_RSP_R2_CID) {
        state->phase = RESP_STOP;
      }
      else {
        state->phase = RESP_CRC;
        state->resp_crc_cnt = '\0';
      }
    }
    state->resp_data_cnt = state->resp_data_cnt + '\x01';
    break;
  case RESP_CRC:
    if (state->resp_crc_cnt == '\0') {
      uVar6 = AnalyzerChannelData::GetSampleNumber();
      *(undefined8 *)frame = uVar6;
      *(undefined8 *)(frame + 0x10) = 0;
      *(undefined8 *)(frame + 0x18) = 0;
      frame[0x20] = (Frame)0x3;
    }
    lVar2 = *(long *)(frame + 0x10);
    uVar5 = AnalyzerChannelData::GetBitState();
    *(ulong *)(frame + 0x10) = (ulong)uVar5 | lVar2 * 2;
    if (state->resp_crc_cnt == '\x06') {
      uVar6 = AnalyzerChannelData::GetSampleNumber();
      *(undefined8 *)(frame + 8) = uVar6;
      AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
      AnalyzerResults::CommitResults();
      Analyzer::ReportProgress((ulonglong)this);
      state->phase = RESP_STOP;
    }
    state->resp_crc_cnt = state->resp_crc_cnt + '\x01';
    break;
  case RESP_STOP:
    pSVar1 = (this->mResults)._M_ptr;
    MVar3 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddMarker((ulonglong)pSVar1,MVar3,(Channel *)0x9);
    if (state->cmdindex == 0xc) {
      state->phase = CMD_INTERRUPT;
      return;
    }
    if (dataState->hasSeveralDataBlocks == true) {
      *(undefined4 *)((long)&state->phase + 3) = 0;
      state->phase = CMD_INIT;
      state->responseType = MMC_RSP_NONE;
      state->timeout = 0;
      *(undefined8 *)((long)&state->timeout + 3) = 0;
      return;
    }
LAB_00106377:
    state->phase = CMD_END;
  }
  return;
}

Assistant:

void SDMMCAnalyzer::ReadCommandBit(CommandReadState *state, DataReadState
		*dataState, struct Frame *frame) {
	switch(state->phase) {
		case CMD_INIT:
			if (mCommand->GetBitState() == BIT_LOW) {
				mResults->AddMarker(mClock->GetSampleNumber(),
						AnalyzerResults::Start, mSettings.mCommandChannel);
				state->phase = CMD_DIR;
			}
			return;
		case CMD_DIR:
			if (mCommand->GetBitState() != BIT_HIGH) {
				mResults->AddMarker(mClock->GetSampleNumber(),
						AnalyzerResults::X, mSettings.mCommandChannel);
				state->phase = CMD_ERROR;
			} else {
				state->phase = CMD_IDX;
			}
			return;
		case CMD_IDX:
			if (state->cmd_idx_cnt == 0) {
				frame->mStartingSampleInclusive = mClock->GetSampleNumber();
				frame->mData1 = 0;
				frame->mData2 = 0;
				frame->mType = SDMMCAnalyzerResults::FRAMETYPE_COMMAND;
				frame->mFlags = 0;
			}
			frame->mData1 = (frame->mData1 << 1) | mCommand->GetBitState();
			if (state->cmd_idx_cnt == 5)
				state->phase = CMD_ARG;
			state->cmd_idx_cnt++;
			return;
		case CMD_ARG:
			frame->mData2 = (frame->mData2 << 1) | mCommand->GetBitState();
			if (state->cmd_arg_cnt == 31) {
				state->phase = CMD_CRC;
				frame->mEndingSampleInclusive = mClock->GetSampleNumber();
				mResults->AddFrame(*frame);
				mResults->CommitResults();
				state->cmdindex = (int)frame->mData1;
				dataState->cmdindex = (int)frame->mData1;
			}
			state->cmd_arg_cnt++;
			return;
		case CMD_CRC:
			if (state->cmd_crc_cnt == 0) {
				frame->mStartingSampleInclusive = mClock->GetSampleNumber();
				frame->mData1 = 0;
				frame->mData2 = 0;
				frame->mType = SDMMCAnalyzerResults::FRAMETYPE_CRC;
				frame->mFlags = 0;
			}
			frame->mData1 = (frame->mData1 << 1) | mCommand->GetBitState();
			if (state->cmd_crc_cnt == 6) {
				state->phase = CMD_STOP;
				frame->mEndingSampleInclusive = mClock->GetSampleNumber();
				mResults->AddFrame(*frame);
				mResults->CommitResults();
			}
			state->cmd_crc_cnt++;
			return;
		case CMD_STOP:
			mResults->AddMarker(mClock->GetSampleNumber(),
					AnalyzerResults::Stop, mSettings.mCommandChannel);
			if (mSettings.mProtocol == PROTOCOL_MMC) {
				struct MMCResponse response = SDMMCHelpers::MMCCommandResponse(state->cmdindex);
				if (response.mType != MMC_RSP_NONE) {
					state->phase = RESP_INIT;
					// prepare RESP parsing
					state->timeout = response.mTimeout + 3; // add some slack time
					state->resp_data_bits = response.mBits;
					state->responseType = response.mType;
					if (response.hasDataBlock &&
							mSettings.mBusWidth != BUS_WIDTH_0) {
						// init DATA state machine
						dataState->phase = DATA_INIT;
						dataState->hasSeveralDataBlocks = response.hasSeveralDataBlocks;
					}
				} else {
					state->phase = CMD_END;
				}
			} else {
				/* FIXME: implement SD response handling */
				state->phase = CMD_END;
			}
			return;
		case RESP_INIT:
			if (mCommand->GetBitState() != BIT_LOW) {
				// Waiting for init
				if (state->timeout == 0) {
					state->phase = CMD_ERROR;
					mResults->AddMarker(mClock->GetSampleNumber(),
							AnalyzerResults::X, mSettings.mCommandChannel);
				} else {
					state->timeout--;
				}
			} else {
				mResults->AddMarker(mClock->GetSampleNumber(),
						AnalyzerResults::Start, mSettings.mCommandChannel);
				state->phase = RESP_DIR;
			}
			return;
		case RESP_DIR:
			if (mCommand->GetBitState() != BIT_LOW) {
				/* if card is not transferring this is no response */
				mResults->AddMarker(mClock->GetSampleNumber(),
						AnalyzerResults::X, mSettings.mCommandChannel);
				state->phase = CMD_ERROR;
			} else {
				state->phase = RESP_IGNORED;
			}
			return;
		case RESP_IGNORED:
			if (state->resp_ignore_cnt == 0) {
				frame->mStartingSampleInclusive = mClock->GetSampleNumber();
				frame->mData1 = 0;
				frame->mData2 = 0;
				frame->mType = SDMMCAnalyzerResults::FRAMETYPE_RESPONSE;
				frame->mFlags = state->responseType;
			}
			if (state->resp_ignore_cnt == 5)
				state->phase = RESP_DATA;
			state->resp_ignore_cnt++;
			return;
		case RESP_DATA:
			if (state->resp_data_cnt < 64) {
				frame->mData1 = (frame->mData1 << 1) | mCommand->GetBitState();
				/* bits 0 to 63 */
			} else {
				frame->mData2 = (frame->mData2 << 1) | mCommand->GetBitState();
				/* bits 64 to 127 */
			}
			/* last data bit only */
			if (state->resp_data_cnt == state->resp_data_bits) {
				// observed: no data block following CMD8 R1 response,
				// EXCEPTION_EVENT bit (6), RESERVED (4) and APP-specific (2)
				// bits set - why?
				if (state->responseType == MMC_RSP_R1 &&
						((frame->mData1 & (1 << 6)) != 0)) {
					dataState->phase = DATA_NOTSTARTED;
				}
				frame->mEndingSampleInclusive = mClock->GetSampleNumber();
				mResults->AddFrame(*frame);
				mResults->CommitResults();
				if (state->responseType != MMC_RSP_R2_CID &&
						state->responseType != MMC_RSP_R2_CSD) {
					state->phase = RESP_CRC;
					state->resp_crc_cnt = 0;
				} else {
					state->phase = RESP_STOP;
				}
			}
			state->resp_data_cnt++;
			return;
		case RESP_CRC:
			/* first crc bit only */
			if (state->resp_crc_cnt == 0) {
				frame->mStartingSampleInclusive = mClock->GetSampleNumber();
				frame->mData1 = 0;
				frame->mData2 = 0;
				frame->mType = SDMMCAnalyzerResults::FRAMETYPE_CRC;
			}
			frame->mData1 = (frame->mData1 << 1) | mCommand->GetBitState();

			/* last crc bit only */
			if (state->resp_crc_cnt == 6) {
				frame->mEndingSampleInclusive = mClock->GetSampleNumber();
				mResults->AddFrame(*frame);
				mResults->CommitResults();
				ReportProgress(frame->mEndingSampleInclusive);
				state->phase = RESP_STOP;
			}
			state->resp_crc_cnt++;
			return;
		case RESP_STOP:
			/* stop bit */
			mResults->AddMarker(mClock->GetSampleNumber(), AnalyzerResults::Stop, mSettings.mCommandChannel);
			if (state->cmdindex == 12) {  // STOP_TRANSMISSION
				state->phase = CMD_INTERRUPT;
				return;
			}
			if (dataState->hasSeveralDataBlocks) {
				// READ MULTIPLE BLOCK / WRITE MULTIPLE BLOCK: wait for another
				// command while data is being transmitted
				state->phase = CMD_INIT;
				// Reset state
				state->cmd_idx_cnt = 0;
				state->cmd_arg_cnt = 0;
				state->cmd_crc_cnt = 0;
				state->responseType = MMC_RSP_NONE;
				state->timeout = 0;
				state->cmdindex = 0;
				state->resp_data_bits = 0;
				state->resp_ignore_cnt = 0;
				state->resp_data_cnt = 0;
			} else {
				state->phase = CMD_END;
			}
			return;
		/* this method does not gets called for END and ERROR phases */
		case CMD_ERROR:
		case CMD_END:
			return;
	}

}